

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

spectral_operation __thiscall kitty::detail::spectrum::disjoint_translation(spectrum *this,int i)

{
  spectral_operation sVar1;
  size_type sVar2;
  reference __a;
  reference __b;
  uint in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint k;
  spectral_operation op;
  uint local_18;
  spectral_operation local_6;
  
  spectral_operation::spectral_operation(&local_6,disjoint_translation,(uint16_t)in_ESI,0);
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 <= local_18) break;
    if ((local_18 & in_ESI) != 0) {
      __a = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)local_18);
      __b = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)(local_18 - in_ESI));
      std::swap<int>(__a,__b);
    }
    local_18 = local_18 + 1;
  }
  sVar1._var2 = local_6._var2;
  sVar1._kind = local_6._kind;
  sVar1._var1 = local_6._var1;
  return sVar1;
}

Assistant:

auto disjoint_translation( int i )
  {
    spectral_operation op( spectral_operation::kind::disjoint_translation, i );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 )
      {
        std::swap( _s[k], _s[k - i] );
      }
    }

    return op;
  }